

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  undefined4 extraout_var_01;
  undefined8 *in_RDX;
  BlockContents *in_RSI;
  BlockHandle *in_RDI;
  long in_FS_OFFSET;
  Iterator *iter;
  Handle *cache_handle;
  Block *block;
  Cache *block_cache;
  Table *table;
  Slice key;
  Status s;
  Slice input;
  BlockHandle handle;
  BlockContents contents;
  char cache_key_buffer [16];
  Block *in_stack_fffffffffffffe78;
  Status *in_stack_fffffffffffffe80;
  Slice *in_stack_fffffffffffffe88;
  BlockContents *in_stack_fffffffffffffe90;
  Block *in_stack_fffffffffffffe98;
  CleanupFunction in_stack_fffffffffffffea0;
  Iterator *in_stack_fffffffffffffea8;
  Comparator *in_stack_fffffffffffffec0;
  Comparator *pCVar4;
  Block *in_stack_fffffffffffffec8;
  Iterator *local_d0;
  long local_b8;
  Block *local_b0;
  ReadOptions *in_stack_ffffffffffffff80;
  RandomAccessFile *in_stack_ffffffffffffff88;
  undefined1 local_70 [16];
  Iterator local_60;
  byte local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = *(Comparator **)(in_RDI->offset_ + 0x30);
  local_b0 = (Block *)0x0;
  local_b8 = 0;
  BlockHandle::BlockHandle((BlockHandle *)in_stack_fffffffffffffe78);
  local_60.cleanup_head_.function = (CleanupFunction)*in_RDX;
  local_60.cleanup_head_.arg1 = (void *)in_RDX[1];
  BlockHandle::DecodeFrom((BlockHandle *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffe78);
  if (bVar1) {
    BlockContents::BlockContents((BlockContents *)in_stack_fffffffffffffe78);
    if (pCVar4 == (Comparator *)0x0) {
      ReadBlock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI,in_RSI);
      in_stack_fffffffffffffea8 = &local_60;
      in_stack_fffffffffffffea0 = (CleanupFunction)&stack0xffffffffffffff80;
      Status::operator=((Status *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      Status::~Status((Status *)in_stack_fffffffffffffe78);
      bVar1 = Status::ok((Status *)in_stack_fffffffffffffe78);
      if (bVar1) {
        in_stack_fffffffffffffe98 = (Block *)operator_new(0x18);
        Block::Block(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        local_b0 = in_stack_fffffffffffffe98;
      }
    }
    else {
      EncodeFixed64((char *)in_stack_fffffffffffffe80,(uint64_t)in_stack_fffffffffffffe88);
      BlockHandle::offset((BlockHandle *)in_stack_fffffffffffffe78);
      EncodeFixed64((char *)in_stack_fffffffffffffe80,(uint64_t)in_stack_fffffffffffffe88);
      Slice::Slice(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                   (size_t)in_stack_fffffffffffffe78);
      iVar2 = (*pCVar4->_vptr_Comparator[3])(pCVar4,local_70);
      local_b8 = CONCAT44(extraout_var,iVar2);
      if (local_b8 == 0) {
        ReadBlock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI,in_RSI);
        Status::operator=((Status *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        Status::~Status((Status *)in_stack_fffffffffffffe78);
        bVar1 = Status::ok((Status *)in_stack_fffffffffffffe78);
        if (bVar1) {
          local_b0 = (Block *)operator_new(0x18);
          Block::Block(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          if (((local_20 & 1) != 0) && (((ulong)(in_RSI->data).data_ & 0x100) != 0)) {
            in_stack_fffffffffffffec8 = local_b0;
            sVar3 = Block::size(in_stack_fffffffffffffe78);
            iVar2 = (*pCVar4->_vptr_Comparator[2])
                              (pCVar4,local_70,in_stack_fffffffffffffec8,sVar3,DeleteCachedBlock);
            local_b8 = CONCAT44(extraout_var_01,iVar2);
            in_stack_fffffffffffffec0 = pCVar4;
          }
        }
      }
      else {
        iVar2 = (*pCVar4->_vptr_Comparator[5])(pCVar4,local_b8);
        local_b0 = (Block *)CONCAT44(extraout_var_00,iVar2);
      }
    }
  }
  if (local_b0 == (Block *)0x0) {
    local_d0 = NewErrorIterator((Status *)in_stack_fffffffffffffe98);
  }
  else {
    local_d0 = Block::NewIterator(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (local_b8 == 0) {
      Iterator::RegisterCleanup
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 local_d0);
    }
    else {
      Iterator::RegisterCleanup
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 local_d0);
    }
  }
  Status::~Status((Status *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d0;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}